

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode JsPointerToString(WCHAR *stringValue,size_t stringLength,JsValueRef *string)

{
  anon_class_24_3_cdb5c303 fn;
  JsErrorCode JVar1;
  JsValueRef *local_20;
  JsValueRef *string_local;
  size_t stringLength_local;
  WCHAR *stringValue_local;
  
  fn.stringLength = (size_t *)&string_local;
  fn.stringValue = (WCHAR **)&stringLength_local;
  fn.string = &local_20;
  local_20 = string;
  string_local = (JsValueRef *)stringLength;
  stringLength_local = (size_t)stringValue;
  JVar1 = ContextAPINoScriptWrapper<JsPointerToString::__0>(fn,false,false);
  return JVar1;
}

Assistant:

END_JSRT_NO_EXCEPTION
}

CHAKRA_API JsPointerToString(_In_reads_(stringLength) const WCHAR *stringValue, _In_ size_t stringLength, _Out_ JsValueRef *string)
{
    return ContextAPINoScriptWrapper([&](Js::ScriptContext *scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION(scriptContext, RecordJsRTCreateString, stringValue, stringLength);

        PARAM_NOT_NULL(stringValue);
        PARAM_NOT_NULL(string);

        if (!Js::IsValidCharCount(stringLength))
        {
            Js::JavascriptError::ThrowOutOfMemoryError(scriptContext);
        }

        *string = Js::JavascriptString::NewCopyBuffer(stringValue, static_cast<charcount_t>(stringLength), scriptContext);

        PERFORM_JSRT_TTD_RECORD_ACTION_RESULT(scriptContext, string);

        return JsNoError;
    });
}